

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

X * __thiscall IMLE::predict(IMLE *this,Z *z)

{
  ArrayX *pAVar1;
  ArrayScal *pAVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pdVar9;
  iterator iVar10;
  pointer pFVar11;
  long lVar12;
  pointer piVar13;
  double *pdVar14;
  double dVar15;
  _Alloc_hider _Var16;
  Mat *pMVar17;
  double *pdVar18;
  undefined8 *puVar19;
  Index index_4;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  Index index;
  Index index_1;
  Index index_3;
  ulong uVar23;
  long lVar24;
  long lVar25;
  Index size_1;
  pointer pMVar26;
  ActualDstType actualDst;
  long lVar27;
  double __tmp;
  Scal SVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  X sumInvRj;
  X sumInvRxj;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  string local_70;
  Mat *local_50 [2];
  ArrayX *local_40;
  ArrayScal *local_38;
  
  pMVar7 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar26 = pMVar7;
  if (pMVar8 != pMVar7) {
    do {
      free((pMVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar26 = pMVar26 + 1;
    } while (pMVar26 != pMVar8);
    (this->predictions).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
  }
  pMVar7 = (this->predictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (this->predictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar26 = pMVar7;
  if (pMVar8 != pMVar7) {
    do {
      free((pMVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar26 = pMVar26 + 1;
    } while (pMVar26 != pMVar8);
    (this->predictionsVar).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
  }
  pdVar9 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar9) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar9;
  }
  if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)this->d) {
    if (this->M < 1) {
      dVar30 = 0.0;
    }
    else {
      dVar30 = 0.0;
      lVar27 = 0;
      lVar25 = 0;
      do {
        SVar28 = LinearExpert::queryZ
                           ((LinearExpert *)
                            ((long)&(((this->experts).
                                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                      .
                                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert
                                    ).d + lVar27),z);
        dVar30 = dVar30 + SVar28;
        lVar25 = lVar25 + 1;
        lVar27 = lVar27 + 0x308;
      } while (lVar25 < this->M);
    }
    if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 1) {
      free((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      pdVar18 = (double *)malloc(8);
      if (pdVar18 == (double *)0x0) goto LAB_00149bc8;
      (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar18;
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 1;
    *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = dVar30;
    dVar30 = dVar30 + this->pNoiseModelZ;
    if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != 1) {
      free((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      pdVar18 = (double *)malloc(8);
      if (pdVar18 == (double *)0x0) goto LAB_00149bc8;
      (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar18;
    }
    (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1
    ;
    *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         dVar30;
    this->sumAll = dVar30;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"IMLE::predict: query dimension does not match input dimension!!"
               ,"");
    message(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 1) {
      free((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      pdVar18 = (double *)malloc(8);
      if (pdVar18 == (double *)0x0) goto LAB_00149bc8;
      (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar18;
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 1;
    *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = 0.0;
  }
  pAVar1 = &this->predictionsVar;
  pAVar2 = &this->predictionsWeight;
  dVar30 = *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  iVar6 = this->M;
  lVar25 = (long)iVar6;
  if ((dVar30 != 0.0) || (NAN(dVar30))) {
    if ((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != lVar25) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar6 < 1) {
        pdVar18 = (double *)0x0;
      }
      else {
        pdVar18 = (double *)malloc(lVar25 * 8);
        if (pdVar18 == (double *)0x0) goto LAB_00149bc8;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar18;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar25;
    lVar27 = (long)this->D;
    lVar25 = (long)this->M;
    local_40 = pAVar1;
    local_38 = pAVar2;
    if ((lVar25 == 0 || lVar27 == 0) ||
       (lVar27 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar25),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar25 * lVar27,lVar27,lVar25)
      ;
      lVar27 = (long)this->D;
      lVar25 = (long)this->M;
      if ((lVar25 == 0 || lVar27 == 0) ||
         (lVar27 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar25),0)))
      {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar25 * lVar27,lVar27,
                   lVar25);
        if (0 < this->M) {
          lVar25 = 0;
          lVar27 = 0;
          do {
            pFVar11 = (this->experts).
                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      .
                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar30 = pFVar11[lVar27].super_LinearExpert.gamma *
                     pFVar11[lVar27].super_LinearExpert.p_z_T +
                     *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[lVar27] = dVar30;
            pdVar18 = (this->fInvRj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar20 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_rows;
            uVar21 = uVar20;
            if ((((ulong)(pdVar18 + uVar20 * lVar27) & 7) == 0) &&
               (uVar21 = (ulong)((uint)((ulong)(pdVar18 + uVar20 * lVar27) >> 3) & 1),
               (long)uVar20 <= (long)uVar21)) {
              uVar21 = uVar20;
            }
            dVar30 = pFVar11[lVar27].super_LinearExpert.p_z_T / dVar30;
            lVar12 = *(long *)&pFVar11[lVar27].super_LinearExpert.invPsi.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
            if (0 < (long)uVar21) {
              uVar23 = 0;
              do {
                *(double *)((long)pdVar18 + uVar23 * 8 + uVar20 * lVar25) =
                     *(double *)(lVar12 + uVar23 * 8) * dVar30;
                uVar23 = uVar23 + 1;
              } while (uVar21 != uVar23);
            }
            lVar24 = uVar20 - uVar21;
            uVar23 = (lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffeU) + uVar21;
            if (1 < lVar24) {
              do {
                pdVar14 = (double *)(lVar12 + uVar21 * 8);
                dVar15 = pdVar14[1];
                pdVar3 = (double *)((long)pdVar18 + uVar21 * 8 + uVar20 * lVar25);
                *pdVar3 = *pdVar14 * dVar30;
                pdVar3[1] = dVar15 * dVar30;
                uVar21 = uVar21 + 2;
              } while ((long)uVar21 < (long)uVar23);
            }
            if ((long)uVar23 < (long)uVar20) {
              do {
                *(double *)((long)pdVar18 + uVar23 * 8 + uVar20 * lVar25) =
                     *(double *)(lVar12 + uVar23 * 8) * dVar30;
                uVar23 = uVar23 + 1;
              } while (uVar20 != uVar23);
            }
            pdVar18 = (this->fInvRj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            lVar12 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_rows;
            pdVar14 = (this->invRxj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            uVar20 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_rows;
            lVar24 = *(long *)&(this->experts).
                               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               .
                               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar27].super_LinearExpert.
                               pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            ;
            uVar21 = uVar20;
            if ((((ulong)(pdVar14 + uVar20 * lVar27) & 7) == 0) &&
               (uVar21 = (ulong)((uint)((ulong)(pdVar14 + uVar20 * lVar27) >> 3) & 1),
               (long)uVar20 <= (long)uVar21)) {
              uVar21 = uVar20;
            }
            if (0 < (long)uVar21) {
              uVar23 = 0;
              do {
                *(double *)((long)pdVar14 + uVar23 * 8 + uVar20 * lVar25) =
                     *(double *)((long)pdVar18 + uVar23 * 8 + lVar12 * lVar25) *
                     *(double *)(lVar24 + uVar23 * 8);
                uVar23 = uVar23 + 1;
              } while (uVar21 != uVar23);
            }
            lVar22 = uVar20 - uVar21;
            uVar23 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar21;
            if (1 < lVar22) {
              do {
                pdVar3 = (double *)(lVar24 + uVar21 * 8);
                dVar30 = pdVar3[1];
                pdVar4 = (double *)((long)pdVar18 + uVar21 * 8 + lVar12 * lVar25);
                dVar15 = pdVar4[1];
                pdVar5 = (double *)((long)pdVar14 + uVar21 * 8 + uVar20 * lVar25);
                *pdVar5 = *pdVar4 * *pdVar3;
                pdVar5[1] = dVar15 * dVar30;
                uVar21 = uVar21 + 2;
              } while ((long)uVar21 < (long)uVar23);
            }
            if ((long)uVar23 < (long)uVar20) {
              do {
                *(double *)((long)pdVar14 + uVar23 * 8 + uVar20 * lVar25) =
                     *(double *)((long)pdVar18 + uVar23 * 8 + lVar12 * lVar25) *
                     *(double *)(lVar24 + uVar23 * 8);
                uVar23 = uVar23 + 1;
              } while (uVar20 != uVar23);
            }
            lVar27 = lVar27 + 1;
            lVar25 = lVar25 + 8;
          } while (lVar27 < this->M);
        }
        local_50[0] = &this->fInvRj;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                   (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                    *)local_50);
        local_88.m_storage.m_data = (double *)&this->invRxj;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_50,
                   (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                    *)&local_88);
        local_88.m_storage.m_data = (double *)0x0;
        local_88.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_88,local_70._M_string_length,1);
        pMVar17 = local_50[0];
        _Var16._M_p = local_70._M_dataplus._M_p;
        if (local_88.m_storage.m_rows != local_70._M_string_length) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_88,local_70._M_string_length,1);
        }
        uVar20 = local_88.m_storage.m_rows - (local_88.m_storage.m_rows >> 0x3f) &
                 0xfffffffffffffffe;
        if (1 < local_88.m_storage.m_rows) {
          lVar25 = 0;
          do {
            auVar29 = divpd(*(undefined1 (*) [16])
                             (&(pMVar17->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                               m_storage.m_data + lVar25),
                            *(undefined1 (*) [16])(_Var16._M_p + lVar25 * 8));
            *(undefined1 (*) [16])(local_88.m_storage.m_data + lVar25) = auVar29;
            lVar25 = lVar25 + 2;
          } while (lVar25 < (long)uVar20);
        }
        if ((long)uVar20 < local_88.m_storage.m_rows) {
          do {
            local_88.m_storage.m_data[uVar20] =
                 (double)(&(pMVar17->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data)[uVar20] / *(double *)(_Var16._M_p + uVar20 * 8);
            uVar20 = uVar20 + 1;
          } while (local_88.m_storage.m_rows != uVar20);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(&this->predictions,(value_type *)&local_88);
        free(local_88.m_storage.m_data);
        local_88.m_storage.m_data = (double *)0x0;
        local_88.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_88,local_70._M_string_length,1);
        pAVar2 = local_38;
        pAVar1 = local_40;
        _Var16._M_p = local_70._M_dataplus._M_p;
        if (local_88.m_storage.m_rows != local_70._M_string_length) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_88,local_70._M_string_length,1);
        }
        auVar29 = _DAT_0018cd00;
        uVar20 = local_88.m_storage.m_rows - (local_88.m_storage.m_rows >> 0x3f) &
                 0xfffffffffffffffe;
        if (1 < local_88.m_storage.m_rows) {
          lVar25 = 0;
          do {
            auVar32 = divpd(auVar29,*(undefined1 (*) [16])(_Var16._M_p + lVar25 * 8));
            *(undefined1 (*) [16])(local_88.m_storage.m_data + lVar25) = auVar32;
            lVar25 = lVar25 + 2;
          } while (lVar25 < (long)uVar20);
        }
        if ((long)uVar20 < local_88.m_storage.m_rows) {
          do {
            local_88.m_storage.m_data[uVar20] = 1.0 / *(double *)(_Var16._M_p + uVar20 * 8);
            uVar20 = uVar20 + 1;
          } while (local_88.m_storage.m_rows != uVar20);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(pAVar1,(value_type *)&local_88);
        free(local_88.m_storage.m_data);
        local_88.m_storage.m_data =
             (double *)
             (*(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data / this->sumAll);
        iVar10._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (pAVar2,iVar10,(value_type *)&local_88);
        }
        else {
          *iVar10._M_current = (double)local_88.m_storage.m_data;
          (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        }
        free(local_50[0]);
        free(local_70._M_dataplus._M_p);
        goto LAB_00149aed;
      }
    }
  }
  else {
    if ((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != lVar25) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar6 < 1) {
        pdVar18 = (double *)0x0;
      }
      else {
        pdVar18 = (double *)malloc(lVar25 * 8);
        if (pdVar18 == (double *)0x0) goto LAB_00149bc8;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar18;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar25;
    auVar32 = _DAT_0018b020;
    auVar29 = _DAT_0018b010;
    if (0 < iVar6) {
      SVar28 = this->pNoiseModelZ;
      pdVar18 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar20 = lVar25 + 0x1fffffffffffffffU & 0x1fffffffffffffff;
      auVar31._8_4_ = (int)uVar20;
      auVar31._0_8_ = uVar20;
      auVar31._12_4_ = (int)(uVar20 >> 0x20);
      lVar27 = 0;
      auVar31 = auVar31 ^ _DAT_0018b020;
      do {
        auVar33._8_4_ = (int)lVar27;
        auVar33._0_8_ = lVar27;
        auVar33._12_4_ = (int)((ulong)lVar27 >> 0x20);
        auVar33 = (auVar33 | auVar29) ^ auVar32;
        if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                    auVar31._4_4_ < auVar33._4_4_) & 1)) {
          pdVar18[lVar27] = SVar28;
        }
        if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
            auVar33._12_4_ <= auVar31._12_4_) {
          pdVar18[lVar27 + 1] = SVar28;
        }
        lVar27 = lVar27 + 2;
      } while ((uVar20 - ((uint)(lVar25 + 0x1fffffffffffffffU) & 1)) + 2 != lVar27);
    }
    lVar27 = (long)this->D;
    lVar25 = (long)this->M;
    if ((lVar25 == 0 || lVar27 == 0) ||
       (lVar27 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar25),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar25 * lVar27,lVar27,lVar25)
      ;
      lVar25 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols *
               (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if (0 < lVar25) {
        memset((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data,0,lVar25 * 8);
      }
      lVar27 = (long)this->D;
      lVar25 = (long)this->M;
      if ((lVar25 == 0 || lVar27 == 0) ||
         (lVar27 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar25),0)))
      {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar25 * lVar27,lVar27,
                   lVar25);
        lVar25 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols *
                 (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (0 < lVar25) {
          memset((this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data,0,lVar25 * 8);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(&this->predictions,&this->zeroX);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(pAVar1,&this->infinityX);
        local_70._M_dataplus._M_p = (pointer)0x0;
        iVar10._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (pAVar2,iVar10,(value_type *)&local_70);
        }
        else {
          *iVar10._M_current = 0.0;
          (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        }
LAB_00149aed:
        this->nSolFound = 1;
        piVar13 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar13) {
          (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar13;
        }
        std::vector<int,_std::allocator<int>_>::resize(&this->sNearest,(long)this->M,0);
        this->solIdx = 0;
        pdVar18 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        lVar25 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
        if ((this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != lVar25) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&(this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     lVar25,1);
        }
        pdVar14 = (this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        uVar20 = (this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        uVar21 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar20) {
          lVar25 = 0;
          do {
            pdVar3 = pdVar18 + lVar25;
            dVar30 = pdVar3[1];
            pdVar4 = pdVar14 + lVar25;
            *pdVar4 = *pdVar3;
            pdVar4[1] = dVar30;
            lVar25 = lVar25 + 2;
          } while (lVar25 < (long)uVar21);
        }
        if ((long)uVar21 < (long)uVar20) {
          do {
            pdVar14[uVar21] = pdVar18[uVar21];
            uVar21 = uVar21 + 1;
          } while (uVar20 != uVar21);
        }
        this->hasPredJacobian = false;
        this->hasPredErrorReductionDrvt = false;
        return (this->predictions).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + this->solIdx;
      }
    }
  }
LAB_00149bc8:
  puVar19 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar19 = operator_delete;
  __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}